

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O1

Result_t * Kumu::Result_t::Delete(Result_t *__return_storage_ptr__,int v)

{
  Result_t *pRVar1;
  undefined4 uVar2;
  Mutex *__mutex;
  ILogSink *this;
  uint uVar3;
  map_entry_t *pmVar4;
  
  __mutex = s_MapLock;
  if (v - 100U < 0xffffff39) {
    this = DefaultLogSink();
    ILogSink::Error(this,"Cannot delete core result code: %ld\n",(ulong)(uint)v);
    Result_t(__return_storage_ptr__,(Result_t *)RESULT_FAIL);
  }
  else {
    if (s_MapLock == (Mutex *)0x0) {
      __assert_fail("s_MapLock",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                    ,99,"static Kumu::Result_t Kumu::Result_t::Delete(int)");
    }
    pthread_mutex_lock((pthread_mutex_t *)s_MapLock);
    if (s_MapSize != 0) {
      uVar3 = 0;
      pmVar4 = s_ResultMap;
LAB_001174d5:
      pmVar4 = pmVar4 + 1;
      if (s_ResultMap[uVar3].rcode != v) goto code_r0x001174e1;
      if (uVar3 + 1 < s_MapSize) {
        do {
          uVar2 = *(undefined4 *)&pmVar4->field_0x4;
          pRVar1 = pmVar4->result;
          s_ResultMap[uVar3].rcode = pmVar4->rcode;
          *(undefined4 *)&s_ResultMap[uVar3].field_0x4 = uVar2;
          s_ResultMap[uVar3].result = pRVar1;
          uVar3 = uVar3 + 1;
          pmVar4 = pmVar4 + 1;
        } while (s_MapSize - 1 != uVar3);
      }
      s_MapSize = s_MapSize - 1;
      Result_t(__return_storage_ptr__,(Result_t *)RESULT_OK);
      goto LAB_00117536;
    }
LAB_001174eb:
    Result_t(__return_storage_ptr__,(Result_t *)RESULT_FALSE);
LAB_00117536:
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return __return_storage_ptr__;
code_r0x001174e1:
  uVar3 = uVar3 + 1;
  if (s_MapSize == uVar3) goto LAB_001174eb;
  goto LAB_001174d5;
}

Assistant:

Kumu::Result_t
Kumu::Result_t::Delete(int v)
{
  if ( v < -99 || v > 99 )
    {
      DefaultLogSink().Error("Cannot delete core result code: %ld\n", v);
      return RESULT_FAIL;
    }

  assert(s_MapLock);
  AutoMutex L(*s_MapLock);

  for ( ui32_t i = 0; i < s_MapSize; ++i )
    {
      if ( s_ResultMap[i].rcode == v )
	{
	  for ( ++i; i < s_MapSize; ++i )
	    s_ResultMap[i-1] = s_ResultMap[i];

	  --s_MapSize;
	  return RESULT_OK;
	}
    }

  return RESULT_FALSE;
}